

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.cpp
# Opt level: O3

bool __thiscall
duckdb::TryCastHugeDecimalToNumeric<short>
          (duckdb *this,hugeint_t input,short *result,CastParameters *parameters,uint8_t scale)

{
  bool bVar1;
  short *result_00;
  PhysicalType params_1;
  ulong uVar2;
  hugeint_t input_00;
  hugeint_t input_01;
  string error;
  hugeint_t power;
  hugeint_t rounding;
  string local_d8;
  hugeint_t local_b8;
  undefined1 *local_a8 [2];
  undefined1 local_98 [16];
  string local_88;
  hugeint_t local_68;
  hugeint_t local_58;
  hugeint_t local_48;
  hugeint_t local_38;
  
  input_01.upper = input.upper;
  local_68.upper = input.lower;
  uVar2 = (ulong)(uint)((int)parameters << 4);
  local_b8.lower = *(uint64_t *)(Hugeint::POWERS_OF_TEN + uVar2);
  local_b8.upper = *(int64_t *)(Hugeint::POWERS_OF_TEN + uVar2 + 8);
  result_00 = result;
  local_68.lower = (uint64_t)this;
  hugeint_t::hugeint_t(&local_48,0);
  params_1 = (PhysicalType)uVar2;
  bVar1 = hugeint_t::operator<(&local_68,&local_48);
  if (bVar1) {
    local_d8._0_16_ = hugeint_t::operator-(&local_b8);
  }
  else {
    local_d8._M_string_length = local_b8.upper;
    local_d8._M_dataplus._M_p = (pointer)local_b8.lower;
  }
  hugeint_t::hugeint_t(&local_58,2);
  local_38 = hugeint_t::operator/((hugeint_t *)&local_d8,&local_58);
  local_d8._0_16_ = hugeint_t::operator+(&local_68,&local_38);
  input_00 = hugeint_t::operator/((hugeint_t *)&local_d8,&local_b8);
  input_01.lower = input_00.upper;
  bVar1 = Hugeint::TryCast<short>((Hugeint *)input_00.lower,input_01,result_00);
  if (!bVar1) {
    local_a8[0] = local_98;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_a8,"Failed to cast decimal value %s to type %s","");
    StandardStringCast<duckdb::hugeint_t>(&local_88,input_00);
    StringUtil::Format<std::__cxx11::string,duckdb::PhysicalType>
              (&local_d8,(StringUtil *)local_a8,&local_88,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_00000005,
               params_1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p);
    }
    if (local_a8[0] != local_98) {
      operator_delete(local_a8[0]);
    }
    HandleCastError::AssignError(&local_d8,(CastParameters *)result);
    if ((hugeint_t *)local_d8._M_dataplus._M_p != (hugeint_t *)&local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p);
    }
  }
  return bVar1;
}

Assistant:

bool TryCastHugeDecimalToNumeric(hugeint_t input, DST &result, CastParameters &parameters, uint8_t scale) {
	const auto power = Hugeint::POWERS_OF_TEN[scale];
	const auto rounding = ((input < 0) ? -power : power) / 2;
	auto scaled_value = (input + rounding) / power;
	if (!TryCast::Operation<hugeint_t, DST>(scaled_value, result)) {
		string error = StringUtil::Format("Failed to cast decimal value %s to type %s",
		                                  ConvertToString::Operation(scaled_value), GetTypeId<DST>());
		HandleCastError::AssignError(error, parameters);
		return false;
	}
	return true;
}